

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

void mg_send_response_line(mg_connection *nc,int status_code,char *extra_headers)

{
  char *pcVar1;
  
  pcVar1 = "OK";
  if (status_code < 0x12e) {
    if (status_code == 0xce) {
      pcVar1 = "Partial Content";
    }
    else if (status_code == 0x12d) {
      pcVar1 = "Moved";
    }
  }
  else if (status_code == 0x12e) {
    pcVar1 = "Found";
  }
  else if (status_code == 0x1a0) {
    pcVar1 = "Requested range not satisfiable";
  }
  else if (status_code == 0x1a2) {
    pcVar1 = "I\'m a teapot";
  }
  mg_printf(nc,"HTTP/1.1 %d %s\r\n",status_code,pcVar1);
  if (extra_headers != (char *)0x0) {
    mg_printf(nc,"%s\r\n",extra_headers);
    return;
  }
  return;
}

Assistant:

void mg_send_response_line(struct mg_connection *nc, int status_code,
                           const char *extra_headers) {
    const char *status_message = "OK";
    switch (status_code) {
        case 206:
            status_message = "Partial Content";
            break;
        case 301:
            status_message = "Moved";
            break;
        case 302:
            status_message = "Found";
            break;
        case 416:
            status_message = "Requested range not satisfiable";
            break;
        case 418:
            status_message = "I'm a teapot";
            break;
    }
    mg_printf(nc, "HTTP/1.1 %d %s\r\n", status_code, status_message);
    if (extra_headers != NULL) {
        mg_printf(nc, "%s\r\n", extra_headers);
    }
}